

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<ninx::parser::element::FunctionCall,_std::default_delete<ninx::parser::element::FunctionCall>_>
 __thiscall ninx::parser::Parser::parse_function_call(Parser *this)

{
  int iVar1;
  Token *pTVar2;
  ParserException *pPVar3;
  string *__args_1;
  string *in_RSI;
  pointer local_108;
  __uniq_ptr_impl<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
  local_d8;
  unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
  local_d0;
  undefined1 local_c8 [8];
  unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_> value
  ;
  unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
  outer_argument;
  string local_b0;
  undefined1 local_8a;
  allocator local_89;
  string local_88;
  Token *local_68;
  Token *error_token;
  undefined1 local_58 [8];
  unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
  argument;
  int result;
  undefined1 local_40 [8];
  vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
  arguments;
  Keyword *call_token;
  Token *token;
  Parser *this_local;
  __single_object *function_call;
  
  pTVar2 = TokenReader::get_token((TokenReader *)(in_RSI + 1));
  if (pTVar2 == (Token *)0x0) {
    local_108 = (pointer)0x0;
  }
  else {
    local_108 = (pointer)__dynamic_cast(pTVar2,&lexer::token::Token::typeinfo,
                                        &lexer::token::Keyword::typeinfo,0);
  }
  arguments.
  super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_108;
  std::
  vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
  ::vector((vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
            *)local_40);
  iVar1 = TokenReader::check_limiter((TokenReader *)(in_RSI + 1),'(');
  if (iVar1 == 1) {
    TokenReader::get_token((TokenReader *)(in_RSI + 1));
    do {
      argument._M_t.
      super___uniq_ptr_impl<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
      ._M_t.
      super__Tuple_impl<0UL,_ninx::parser::element::FunctionCallArgument_*,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
      .super__Head_base<0UL,_ninx::parser::element::FunctionCallArgument_*,_false>._M_head_impl.
      _0_4_ = TokenReader::check_limiter((TokenReader *)(in_RSI + 1),')');
      if ((int)argument._M_t.
               super___uniq_ptr_impl<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
               ._M_t.
               super__Tuple_impl<0UL,_ninx::parser::element::FunctionCallArgument_*,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
               .super__Head_base<0UL,_ninx::parser::element::FunctionCallArgument_*,_false>.
               _M_head_impl != 0) break;
      parse_function_call_argument((Parser *)local_58);
      std::
      vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
      ::push_back((vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
                   *)local_40,(value_type *)local_58);
      iVar1 = TokenReader::check_limiter((TokenReader *)(in_RSI + 1),',');
      if (iVar1 == 1) {
        TokenReader::get_token((TokenReader *)(in_RSI + 1));
        error_token._4_4_ = 0;
      }
      else {
        iVar1 = TokenReader::check_limiter((TokenReader *)(in_RSI + 1),')');
        if (iVar1 != 1) {
          local_68 = TokenReader::get_token((TokenReader *)(in_RSI + 1));
          local_8a = 1;
          pPVar3 = (ParserException *)__cxa_allocate_exception(0x20);
          pTVar2 = local_68;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_88,"Another argument or end of arguments expected.",&local_89)
          ;
          exception::ParserException::ParserException(pPVar3,pTVar2,in_RSI,&local_88);
          local_8a = 0;
          __cxa_throw(pPVar3,&exception::ParserException::typeinfo,
                      exception::ParserException::~ParserException);
        }
        error_token._4_4_ = 3;
      }
      std::
      unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
      ::~unique_ptr((unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
                     *)local_58);
    } while (error_token._4_4_ == 0);
    TokenReader::get_token((TokenReader *)(in_RSI + 1));
    if ((int)argument._M_t.
             super___uniq_ptr_impl<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
             ._M_t.
             super__Tuple_impl<0UL,_ninx::parser::element::FunctionCallArgument_*,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
             .super__Head_base<0UL,_ninx::parser::element::FunctionCallArgument_*,_false>.
             _M_head_impl == -1) {
      outer_argument._M_t.
      super___uniq_ptr_impl<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
      ._M_t.
      super__Tuple_impl<0UL,_ninx::parser::element::FunctionCallArgument_*,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
      .super__Head_base<0UL,_ninx::parser::element::FunctionCallArgument_*,_false>._M_head_impl.
      _6_1_ = 1;
      pPVar3 = (ParserException *)__cxa_allocate_exception(0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_b0,"Expected \')\' but EOF has been reached.",
                 (allocator *)
                 ((long)&outer_argument._M_t.
                         super___uniq_ptr_impl<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ninx::parser::element::FunctionCallArgument_*,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
                         .
                         super__Head_base<0UL,_ninx::parser::element::FunctionCallArgument_*,_false>
                         ._M_head_impl + 7));
      exception::ParserException::ParserException(pPVar3,(Token *)0x0,in_RSI,&local_b0);
      outer_argument._M_t.
      super___uniq_ptr_impl<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
      ._M_t.
      super__Tuple_impl<0UL,_ninx::parser::element::FunctionCallArgument_*,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
      .super__Head_base<0UL,_ninx::parser::element::FunctionCallArgument_*,_false>._M_head_impl.
      _6_1_ = 0;
      __cxa_throw(pPVar3,&exception::ParserException::typeinfo,
                  exception::ParserException::~ParserException);
    }
  }
  std::
  unique_ptr<ninx::parser::element::FunctionCallArgument,std::default_delete<ninx::parser::element::FunctionCallArgument>>
  ::unique_ptr<std::default_delete<ninx::parser::element::FunctionCallArgument>,void>
            ((unique_ptr<ninx::parser::element::FunctionCallArgument,std::default_delete<ninx::parser::element::FunctionCallArgument>>
              *)&value,(nullptr_t)0x0);
  iVar1 = TokenReader::check_limiter((TokenReader *)(in_RSI + 1),'{');
  if (iVar1 == 1) {
    parse_block((Parser *)local_c8);
    local_d8._M_t.
    super__Tuple_impl<0UL,_ninx::parser::element::Block_*,_std::default_delete<ninx::parser::element::Block>_>
    .super__Head_base<0UL,_ninx::parser::element::Block_*,_false>._M_head_impl =
         (tuple<ninx::parser::element::Block_*,_std::default_delete<ninx::parser::element::Block>_>)
         (_Tuple_impl<0UL,_ninx::parser::element::Block_*,_std::default_delete<ninx::parser::element::Block>_>
          )0x0;
    std::
    make_unique<ninx::parser::element::FunctionCallArgument,decltype(nullptr),std::unique_ptr<ninx::parser::element::Block,std::default_delete<ninx::parser::element::Block>>>
              ((void **)&local_d0,
               (unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                *)&local_d8);
    std::
    unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
    ::operator=((unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
                 *)&value,&local_d0);
    std::
    unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
    ::~unique_ptr(&local_d0);
    std::
    unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>::
    ~unique_ptr((unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                 *)local_c8);
  }
  __args_1 = lexer::token::Keyword::get_keyword_abi_cxx11_
                       ((Keyword *)
                        arguments.
                        super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  lexer::token::Keyword::is_late
            ((Keyword *)
             arguments.
             super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  make_unique<ninx::parser::element::FunctionCall,std::__cxx11::string_const&,std::vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,std::default_delete<ninx::parser::element::FunctionCallArgument>>,std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,std::default_delete<ninx::parser::element::FunctionCallArgument>>>>,std::unique_ptr<ninx::parser::element::FunctionCallArgument,std::default_delete<ninx::parser::element::FunctionCallArgument>>,bool>
            (&this->origin,
             (vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
              *)__args_1,
             (unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
              *)local_40,(bool *)&value);
  error_token._4_4_ = 1;
  std::
  unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
  ::~unique_ptr((unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
                 *)&value);
  std::
  vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
  ::~vector((vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
             *)local_40);
  return (__uniq_ptr_data<ninx::parser::element::FunctionCall,_std::default_delete<ninx::parser::element::FunctionCall>,_true,_true>
          )(__uniq_ptr_data<ninx::parser::element::FunctionCall,_std::default_delete<ninx::parser::element::FunctionCall>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<FunctionCall> ninx::parser::Parser::parse_function_call() {
    auto token{reader.get_token()};
    auto call_token{dynamic_cast<ninx::lexer::token::Keyword *>(token)};

    std::vector<std::unique_ptr<FunctionCallArgument>> arguments;

    // Parse optional call parameters
    if (reader.check_limiter('(') == 1) {
        reader.get_token();

        // Cycle until a closing parenthesis is found or EOF is reached
        int result;
        while ((result = reader.check_limiter(')')) == 0) {
            auto argument{parse_function_call_argument()};

            arguments.push_back(std::move(argument));

            if (reader.check_limiter(',') == 1) {
                // Skip the period limiter
                reader.get_token();
            } else if (reader.check_limiter(')') == 1) {
                break;
            } else {
                auto error_token{reader.get_token()};
                throw ParserException(error_token, this->origin, "Another argument or end of arguments expected.");
            }
        }
        reader.get_token(); // Skip the closing parenthesis
        if (result == -1) {
            throw ParserException(nullptr, this->origin, "Expected ')' but EOF has been reached.");
        }
    }

    std::unique_ptr<FunctionCallArgument> outer_argument{nullptr};

    // Check if there is a block argument at the end
    if (reader.check_limiter('{') == 1) {
        auto value{parse_block()};

        outer_argument = std::make_unique<FunctionCallArgument>(nullptr, std::move(value));
    }

    auto function_call = std::make_unique<FunctionCall>(call_token->get_keyword(), std::move(arguments),
                                                        std::move(outer_argument), call_token->is_late());

    return function_call;
}